

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  char cVar1;
  date_t input_00;
  date_t input_01;
  reference stats;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  LogicalType aLStack_118 [24];
  BaseStatistics local_100 [88];
  LogicalType local_a8 [64];
  Value local_68 [64];
  
  this_00 = *(vector<duckdb::BaseStatistics,_true> **)(input + 0x10);
  stats = vector<duckdb::BaseStatistics,_true>::operator[](this_00,1);
  cVar1 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar1 != '\0') {
    input_00 = NumericStats::GetMin<duckdb::date_t>(stats);
    input_01 = NumericStats::GetMax<duckdb::date_t>(stats);
    if (input_00.days <= input_01.days) {
      DateTrunc::UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
                (input_00);
      DateTrunc::UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
                (input_01);
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_a8);
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_68);
      duckdb::LogicalType::LogicalType(aLStack_118,local_a8);
      duckdb::NumericStats::CreateEmpty(local_100,aLStack_118);
      duckdb::LogicalType::~LogicalType(aLStack_118);
      duckdb::NumericStats::SetMin(local_100,(Value *)local_a8);
      duckdb::NumericStats::SetMax(local_100,local_68);
      vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
      duckdb::BaseStatistics::CopyValidity(local_100);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_100);
      duckdb::Value::~Value(local_68);
      duckdb::Value::~Value((Value *)local_a8);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}